

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O2

void tcg_out_ld(TCGContext_conflict9 *s,TCGType_conflict type,TCGReg ret,TCGReg arg1,intptr_t arg2)

{
  int iVar1;
  
  switch(type) {
  case TCG_TYPE_I32:
    if (ret < TCG_REG_XMM0) {
      iVar1 = 0x8b;
LAB_00b2717c:
      tcg_out_modrm_offset(s,iVar1,ret,arg1,arg2);
      return;
    }
    iVar1 = 0x56e;
    break;
  case TCG_TYPE_I64:
    if (ret < TCG_REG_XMM0) {
      iVar1 = 0x108b;
      goto LAB_00b2717c;
    }
  case TCG_TYPE_V64:
    iVar1 = 0x2017e;
    break;
  case TCG_TYPE_V128:
    iVar1 = 0x56f;
    break;
  case TCG_TYPE_V256:
    iVar1 = 0xa016f;
    break;
  default:
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/i386/tcg-target.inc.c"
               ,0x459,(char *)0x0);
  }
  tcg_out_vex_modrm_offset(s,iVar1,ret,0,arg1,arg2);
  return;
}

Assistant:

static void tcg_out_ld(TCGContext *s, TCGType type, TCGReg ret,
                       TCGReg arg1, intptr_t arg2)
{
    switch (type) {
    case TCG_TYPE_I32:
        if (ret < 16) {
            tcg_out_modrm_offset(s, OPC_MOVL_GvEv, ret, arg1, arg2);
        } else {
            tcg_out_vex_modrm_offset(s, OPC_MOVD_VyEy, ret, 0, arg1, arg2);
        }
        break;
    case TCG_TYPE_I64:
        if (ret < 16) {
            tcg_out_modrm_offset(s, OPC_MOVL_GvEv | P_REXW, ret, arg1, arg2);
            break;
        }
        /* FALLTHRU */
    case TCG_TYPE_V64:
        /* There is no instruction that can validate 8-byte alignment.  */
        tcg_debug_assert(ret >= 16);
        tcg_out_vex_modrm_offset(s, OPC_MOVQ_VqWq, ret, 0, arg1, arg2);
        break;
    case TCG_TYPE_V128:
        /*
         * The gvec infrastructure is asserts that v128 vector loads
         * and stores use a 16-byte aligned offset.  Validate that the
         * final pointer is aligned by using an insn that will SIGSEGV.
         */
        tcg_debug_assert(ret >= 16);
        tcg_out_vex_modrm_offset(s, OPC_MOVDQA_VxWx, ret, 0, arg1, arg2);
        break;
    case TCG_TYPE_V256:
        /*
         * The gvec infrastructure only requires 16-byte alignment,
         * so here we must use an unaligned load.
         */
        tcg_debug_assert(ret >= 16);
        tcg_out_vex_modrm_offset(s, OPC_MOVDQU_VxWx | P_VEXL,
                                 ret, 0, arg1, arg2);
        break;
    default:
        g_assert_not_reached();
    }
}